

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O3

CURLcode setup_range(Curl_easy *data)

{
  undefined1 *puVar1;
  char *pcVar2;
  uint uVar3;
  long lVar4;
  
  lVar4 = (data->set).set_resume_from;
  (data->state).resume_from = lVar4;
  if ((lVar4 == 0) && ((data->set).str[0x28] == (char *)0x0)) {
    puVar1 = &(data->state).field_0x775;
    *puVar1 = *puVar1 & 0xfe;
  }
  else {
    if (((data->state).field_0x775 & 2) != 0) {
      (*Curl_cfree)((data->state).range);
      lVar4 = (data->state).resume_from;
    }
    if (lVar4 == 0) {
      pcVar2 = (*Curl_cstrdup)((data->set).str[0x28]);
    }
    else {
      pcVar2 = curl_maprintf("%ld-");
    }
    uVar3 = *(uint *)&(data->state).field_0x774 & 0xfffffdff | (uint)(pcVar2 != (char *)0x0) << 9;
    (data->state).range = pcVar2;
    *(uint *)&(data->state).field_0x774 = uVar3;
    if (pcVar2 == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    *(uint *)&(data->state).field_0x774 = uVar3 | 0x100;
  }
  return CURLE_OK;
}

Assistant:

static CURLcode setup_range(struct Curl_easy *data)
{
  struct UrlState *s = &data->state;
  s->resume_from = data->set.set_resume_from;
  if(s->resume_from || data->set.str[STRING_SET_RANGE]) {
    if(s->rangestringalloc)
      free(s->range);

    if(s->resume_from)
      s->range = aprintf("%" FMT_OFF_T "-", s->resume_from);
    else
      s->range = strdup(data->set.str[STRING_SET_RANGE]);

    s->rangestringalloc = (s->range) ? TRUE : FALSE;

    if(!s->range)
      return CURLE_OUT_OF_MEMORY;

    /* tell ourselves to fetch this range */
    s->use_range = TRUE;        /* enable range download */
  }
  else
    s->use_range = FALSE; /* disable range download */

  return CURLE_OK;
}